

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O3

bool __thiscall
vkt::shaderexecutor::BitfieldInsertCaseInstance::compare
          (BitfieldInsertCaseInstance *this,void **inputs,void **outputs)

{
  pointer pSVar1;
  long lVar2;
  uint uVar3;
  ostream *stream;
  byte bVar4;
  ostringstream *this_00;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  Hex<8UL> local_38;
  
  pSVar1 = (this->super_IntegerFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = *(uint *)((long)&(pSVar1->varType).m_data + 4);
  uVar3 = glu::getDataTypeScalarSize((pSVar1->varType).m_data.basic.type);
  bVar10 = true;
  if (0 < (int)uVar3) {
    uVar6 = (2 << ((&DAT_00b5bd78)[(ulong)uVar6 * 4] - 1 & 0x1f)) - 1;
    uVar7 = ~(-1 << ((byte)*inputs[3] & 0x1f));
    if (*inputs[3] == 0x20) {
      uVar7 = 0xffffffff;
    }
    bVar4 = (byte)*inputs[2];
    uVar8 = ~(uVar7 << (bVar4 & 0x1f));
    uVar5 = (*inputs[1] & uVar7) << (bVar4 & 0x1f) | **inputs & uVar8;
    uVar9 = 0;
    bVar10 = false;
    if (((**outputs ^ uVar5) & uVar6) == 0) {
      uVar9 = 0;
      do {
        if ((ulong)uVar3 - 1 == uVar9) {
          return true;
        }
        uVar5 = (*(uint *)((long)inputs[1] + (uVar9 + 1) * 4) & uVar7) << (bVar4 & 0x1f) |
                *(uint *)((long)*inputs + (uVar9 + 1) * 4) & uVar8;
        lVar2 = uVar9 + 1;
        uVar9 = uVar9 + 1;
      } while (((*(uint *)((long)*outputs + lVar2 * 4) ^ uVar5) & uVar6) == 0);
      bVar10 = uVar3 <= uVar9;
    }
    this_00 = &(this->super_IntegerFunctionTestInstance).m_failMsg;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Expected [",10);
    stream = (ostream *)std::ostream::operator<<(this_00,(int)uVar9);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"] = ",4);
    local_38.value = (deUint64)uVar5;
    tcu::Format::Hex<8UL>::toStream(&local_38,stream);
  }
  return bVar10;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const int				integerLength	= getShaderUintBitCount(m_shaderType, precision);
		const deUint32			cmpMask			= getLowBitMask(integerLength);
		const int				offset			= *((const int*)inputs[2]);
		const int				bits			= *((const int*)inputs[3]);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const deUint32	base	= ((const deUint32*)inputs[0])[compNdx];
			const deUint32	insert	= ((const deUint32*)inputs[1])[compNdx];
			const deInt32	out		= ((const deUint32*)outputs[0])[compNdx];

			const deUint32	mask	= bits == 32 ? ~0u : (1u<<bits)-1;
			const deUint32	ref		= (base & ~(mask<<offset)) | ((insert & mask)<<offset);

			if ((out&cmpMask) != (ref&cmpMask))
			{
				m_failMsg << "Expected [" << compNdx << "] = " << tcu::toHex(ref);
				return false;
			}
		}

		return true;
	}